

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation.cpp
# Opt level: O1

Matrix<double,_2,_1,_0,_2,_1> __thiscall
cp::interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::inter5
          (interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this,double t)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *in_RSI;
  Matrix<double,_2,_1,_0,_2,_1> MVar6;
  
  dVar2 = pow(t,3.0);
  dVar3 = pow(t,4.0);
  dVar4 = pow(t,5.0);
  MVar6.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       t * t * in_RSI[4] + t * in_RSI[2] + *in_RSI;
  dVar5 = dVar4 * in_RSI[10] +
          dVar3 * in_RSI[8] +
          dVar2 * in_RSI[6] +
          MVar6.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
          [1];
  dVar2 = dVar4 * in_RSI[0xb] +
          dVar3 * in_RSI[9] + dVar2 * in_RSI[7] + t * t * in_RSI[5] + t * in_RSI[3] + in_RSI[1];
  auVar1._8_4_ = SUB84(dVar2,0);
  auVar1._0_8_ = dVar5;
  auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
  *(undefined1 (*) [16])
   this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       auVar1;
  MVar6.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar5;
  return (Matrix<double,_2,_1,_0,_2,_1>)
         MVar6.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

T interpolation<T>::inter5(double t) {
    return (a[0] + a[1]*t + a[2]*pow(t, 2) + a[3]*pow(t, 3) + a[4]*pow(t, 4) + a[5]*pow(t, 5));
}